

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O1

void mat_inf_norm_cols(csc *M,c_float *E)

{
  double dVar1;
  long lVar2;
  c_int *pcVar3;
  long lVar4;
  c_float *pcVar5;
  long lVar6;
  long lVar7;
  c_float cVar8;
  double dVar9;
  
  lVar2 = M->n;
  if (0 < lVar2) {
    memset(E,0,lVar2 * 8);
    pcVar3 = M->p;
    lVar6 = 0;
    do {
      lVar7 = pcVar3[lVar6];
      lVar4 = pcVar3[lVar6 + 1];
      if (lVar7 < lVar4) {
        pcVar5 = M->x;
        cVar8 = E[lVar6];
        do {
          dVar1 = pcVar5[lVar7];
          dVar9 = -dVar1;
          if (-dVar1 <= dVar1) {
            dVar9 = dVar1;
          }
          if (dVar9 <= cVar8) {
            dVar9 = cVar8;
          }
          cVar8 = dVar9;
          E[lVar6] = cVar8;
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar2);
  }
  return;
}

Assistant:

void mat_inf_norm_cols(const csc *M, c_float *E) {
  c_int j, ptr;

  // Initialize zero max elements
  for (j = 0; j < M->n; j++) {
    E[j] = 0.;
  }

  // Compute maximum across columns
  for (j = 0; j < M->n; j++) {
    for (ptr = M->p[j]; ptr < M->p[j + 1]; ptr++) {
      E[j] = c_max(c_absval(M->x[ptr]), E[j]);
    }
  }
}